

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ScriptSession::eval
          (ConstantValue *__return_storage_ptr__,ScriptSession *this,string_view text)

{
  SyntaxKind SVar1;
  undefined8 symbol_00;
  bool bVar2;
  __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  DataDeclarationSyntax *syntax;
  iterator ppVVar3;
  CompilationUnitSyntax *pCVar4;
  ExpressionSyntax *expr;
  StatementSyntax *stmt;
  logic_error *this_02;
  char *in_R9;
  string_view path;
  string_view text_00;
  string_view name;
  string local_248;
  allocator<char> local_221;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  MemberSyntax *local_180;
  MemberSyntax *member;
  iterator __end3_1;
  iterator __begin3_1;
  SyntaxList<slang::syntax::MemberSyntax> *__range3_1;
  ConstantValue local_138;
  Expression *local_110;
  Expression *initializer;
  ConstantValue initial;
  ValueSymbol *symbol;
  iterator __end3;
  iterator __begin3;
  SmallVector<const_slang::ast::ValueSymbol_*,_5UL> *__range3;
  SmallVector<const_slang::ast::ValueSymbol_*,_5UL> symbols;
  SyntaxNode *node;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  ScriptSession *local_48;
  char *pcStack_40;
  shared_ptr<slang::syntax::SyntaxTree> local_38;
  ScriptSession *local_28;
  ScriptSession *this_local;
  string_view text_local;
  
  pcStack_40 = text._M_str;
  local_48 = (ScriptSession *)text._M_len;
  local_28 = this;
  this_local = local_48;
  text_local._M_len = (size_t)pcStack_40;
  text_local._M_str = (char *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"source");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"");
  path._M_str = in_R9;
  path._M_len = (size_t)local_58._M_str;
  text_00._M_str = (char *)local_48;
  text_00._M_len = (size_t)&local_38;
  name._M_str = (char *)local_58._M_len;
  name._M_len = (size_t)pcStack_40;
  slang::syntax::SyntaxTree::fromText(text_00,name,path);
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
  ::emplace_back<std::shared_ptr<slang::syntax::SyntaxTree>>
            ((vector<std::shared_ptr<slang::syntax::SyntaxTree>,std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>>>
              *)&this->syntaxTrees,&local_38);
  std::shared_ptr<slang::syntax::SyntaxTree>::~shared_ptr(&local_38);
  this_00 = (__shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::
               vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
               ::back(&this->syntaxTrees);
  this_01 = std::
            __shared_ptr_access<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(this_00);
  symbols.stackBase._24_8_ = slang::syntax::SyntaxTree::root(this_01);
  SVar1 = ((SyntaxNode *)symbols.stackBase._24_8_)->kind;
  if (SVar1 == CompilationUnit) {
    pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::CompilationUnitSyntax>
                       ((SyntaxNode *)symbols.stackBase._24_8_);
    __begin3_1 = (iterator)&pCVar4->members;
    __end3_1 = nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::begin
                         (&(pCVar4->members).
                           super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>);
    member = (MemberSyntax *)
             nonstd::span_lite::span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::MemberSyntax_*,_18446744073709551615UL> *)
                        (__begin3_1 + 4));
    for (; (MemberSyntax *)__end3_1 != member; __end3_1 = __end3_1 + 1) {
      local_180 = *__end3_1;
      CompilationUnitSymbol::addMembers(this->scope,&local_180->super_SyntaxNode);
    }
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else if (SVar1 == DataDeclaration) {
    SmallVector<const_slang::ast::ValueSymbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::ValueSymbol_*,_5UL> *)&__range3);
    syntax = slang::syntax::SyntaxNode::as<slang::syntax::DataDeclarationSyntax>
                       ((SyntaxNode *)symbols.stackBase._24_8_);
    VariableSymbol::fromSyntax
              (&this->compilation,syntax,&this->scope->super_Scope,
               (SmallVectorBase<const_slang::ast::ValueSymbol_*> *)&__range3);
    __end3 = SmallVectorBase<const_slang::ast::ValueSymbol_*>::begin
                       ((SmallVectorBase<const_slang::ast::ValueSymbol_*> *)&__range3);
    ppVVar3 = SmallVectorBase<const_slang::ast::ValueSymbol_*>::end
                        ((SmallVectorBase<const_slang::ast::ValueSymbol_*> *)&__range3);
    for (; __end3 != ppVVar3; __end3 = __end3 + 1) {
      initial.value.
      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      .
      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ._32_8_ = *__end3;
      Scope::addMember(&this->scope->super_Scope,
                       (Symbol *)
                       initial.value.
                       super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       .
                       super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                       ._32_8_);
      slang::ConstantValue::ConstantValue((ConstantValue *)&initializer);
      local_110 = ValueSymbol::getInitializer
                            ((ValueSymbol *)
                             initial.value.
                             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             ._32_8_);
      if (local_110 != (Expression *)0x0) {
        Expression::eval(&local_138,local_110,&this->evalContext);
        slang::ConstantValue::operator=((ConstantValue *)&initializer,&local_138);
        slang::ConstantValue::~ConstantValue(&local_138);
      }
      symbol_00 = initial.value.
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  ._32_8_;
      slang::ConstantValue::ConstantValue
                ((ConstantValue *)&__range3_1,(ConstantValue *)&initializer);
      EvalContext::createLocal
                (&this->evalContext,(ValueSymbol *)symbol_00,(ConstantValue *)&__range3_1);
      slang::ConstantValue::~ConstantValue((ConstantValue *)&__range3_1);
      slang::ConstantValue::~ConstantValue((ConstantValue *)&initializer);
    }
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    SmallVector<const_slang::ast::ValueSymbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::ValueSymbol_*,_5UL> *)&__range3);
  }
  else if ((((SVar1 == FunctionDeclaration) || (SVar1 == HierarchyInstantiation)) ||
           (SVar1 == InterfaceDeclaration)) ||
          (((SVar1 == ModuleDeclaration || (SVar1 == ParameterDeclarationStatement)) ||
           ((SVar1 == TaskDeclaration || (SVar1 == TypedefDeclaration)))))) {
    CompilationUnitSymbol::addMembers(this->scope,(SyntaxNode *)symbols.stackBase._24_8_);
    slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    bVar2 = slang::syntax::ExpressionSyntax::isKind(((SyntaxNode *)symbols.stackBase._24_8_)->kind);
    if (bVar2) {
      expr = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>
                       ((SyntaxNode *)symbols.stackBase._24_8_);
      evalExpression(__return_storage_ptr__,this,expr);
    }
    else {
      bVar2 = slang::syntax::StatementSyntax::isKind(*(SyntaxKind *)(symbols.stackBase._24_8_ + 8));
      if (!bVar2) {
        this_02 = (logic_error *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/ScriptSession.cpp"
                   ,&local_221);
        std::operator+(&local_200,&local_220,":");
        std::__cxx11::to_string(&local_248,0x4e);
        std::operator+(&local_1e0,&local_200,&local_248);
        std::operator+(&local_1c0,&local_1e0,": ");
        std::operator+(&local_1a0,&local_1c0,"Default case should be unreachable!");
        std::logic_error::logic_error(this_02,(string *)&local_1a0);
        __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      stmt = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>
                       ((SyntaxNode *)symbols.stackBase._24_8_);
      evalStatement(this,stmt);
      slang::ConstantValue::ConstantValue(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ScriptSession::eval(string_view text) {
    syntaxTrees.emplace_back(SyntaxTree::fromText(text));

    const auto& node = syntaxTrees.back()->root();
    switch (node.kind) {
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::TypedefDeclaration:
            scope.addMembers(node);
            return nullptr;
        case SyntaxKind::DataDeclaration: {
            SmallVector<const ValueSymbol*> symbols;
            VariableSymbol::fromSyntax(compilation, node.as<DataDeclarationSyntax>(), scope,
                                       symbols);

            for (auto symbol : symbols) {
                scope.addMember(*symbol);

                ConstantValue initial;
                if (auto initializer = symbol->getInitializer())
                    initial = initializer->eval(evalContext);

                evalContext.createLocal(symbol, initial);
            }
            return nullptr;
        }
        case SyntaxKind::CompilationUnit:
            for (auto member : node.as<CompilationUnitSyntax>().members)
                scope.addMembers(*member);
            return nullptr;
        default:
            if (ExpressionSyntax::isKind(node.kind)) {
                return evalExpression(node.as<ExpressionSyntax>());
            }
            else if (StatementSyntax::isKind(node.kind)) {
                evalStatement(node.as<StatementSyntax>());
                return nullptr;
            }
            else {
                // If this throws, ScriptSession doesn't currently support whatever construct
                // you were trying to evaluate. Add support to the case above.
                ASSUME_UNREACHABLE;
            }
    }
}